

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  size_t __n;
  pointer __s;
  string_view close_trim;
  int iVar1;
  size_type __rlen_1;
  void *pvVar2;
  size_t sVar3;
  LexerConfig *pLVar4;
  Lexer *this_00;
  size_type sVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  Kind closeKind;
  size_type __rlen;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  string_view sVar14;
  string_view close;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  basic_string_view<char,_std::char_traits<char>_> __str_07;
  string_view text;
  char *pcVar15;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  Token *local_80;
  LexerConfig *local_78;
  ulong local_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar7 = (this->m_in)._M_len;
  uVar12 = this->pos;
  this->tok_start = uVar12;
  local_80 = __return_storage_ptr__;
  if (uVar7 <= uVar12) {
LAB_0012c6f6:
    pcVar11 = (this->m_in)._M_str;
    __return_storage_ptr__->kind = Eof;
    (__return_storage_ptr__->text)._M_len = 0;
    (__return_storage_ptr__->text)._M_str = pcVar11 + uVar7;
    return __return_storage_ptr__;
  }
LAB_0012c3d2:
  switch(this->state) {
  case ExpressionStart:
    this->state = ExpressionBody;
    uVar10 = this->pos + (this->config->expression_open)._M_string_length;
    goto LAB_0012c8ee;
  case ExpressionStartForceLstrip:
    this->state = ExpressionBody;
    uVar10 = this->pos + (this->config->expression_open_force_lstrip)._M_string_length;
LAB_0012c8ee:
    this->pos = uVar10;
    if (uVar10 < uVar12) {
      uVar10 = uVar12;
    }
    if (uVar7 <= uVar10) {
      uVar10 = uVar7;
    }
    uVar8 = uVar7 - uVar12;
    if (uVar10 - uVar12 <= uVar7 - uVar12) {
      uVar8 = uVar10 - uVar12;
    }
    pcVar11 = (this->m_in)._M_str + uVar12;
    __return_storage_ptr__->kind = ExpressionOpen;
    goto LAB_0012c9ae;
  case ExpressionBody:
    pLVar4 = this->config;
    pcVar11 = (pLVar4->expression_close)._M_dataplus._M_p;
    sVar9 = (pLVar4->expression_close)._M_string_length;
    pcVar15 = (pLVar4->expression_close_force_rstrip)._M_dataplus._M_p;
    sVar3 = (pLVar4->expression_close_force_rstrip)._M_string_length;
    closeKind = ExpressionClose;
    local_58 = sVar3;
    pcStack_50 = pcVar15;
    goto LAB_0012c877;
  case LineStart:
    this->state = LineBody;
    uVar10 = this->pos + (this->config->line_statement)._M_string_length;
    this->pos = uVar10;
    if (uVar10 < uVar12) {
      uVar10 = uVar12;
    }
    if (uVar7 <= uVar10) {
      uVar10 = uVar7;
    }
    uVar8 = uVar7 - uVar12;
    if (uVar10 - uVar12 <= uVar7 - uVar12) {
      uVar8 = uVar10 - uVar12;
    }
    pcVar11 = (this->m_in)._M_str + uVar12;
    __return_storage_ptr__->kind = LineStatementOpen;
    goto LAB_0012c9ae;
  case LineBody:
    local_48 = 0;
    uStack_40 = 0;
    sVar3 = 0;
    pcVar15 = (char *)0x0;
    pcVar11 = "\n";
    sVar9 = 1;
    closeKind = LineStatementClose;
LAB_0012c877:
    bVar13 = false;
LAB_0012c9f9:
    close_trim._M_str = pcVar15;
    close_trim._M_len = sVar3;
    close._M_str = pcVar11;
    close._M_len = sVar9;
    scan_body(__return_storage_ptr__,this,close,closeKind,close_trim,bVar13);
    return __return_storage_ptr__;
  case StatementStart:
    this->state = StatementBody;
    uVar10 = this->pos + (this->config->statement_open)._M_string_length;
    break;
  case StatementStartNoLstrip:
    this->state = StatementBody;
    uVar10 = this->pos + (this->config->statement_open_no_lstrip)._M_string_length;
    break;
  case StatementStartForceLstrip:
    this->state = StatementBody;
    uVar10 = this->pos + (this->config->statement_open_force_lstrip)._M_string_length;
    break;
  case StatementBody:
    pLVar4 = this->config;
    pcVar11 = (pLVar4->statement_close)._M_dataplus._M_p;
    sVar9 = (pLVar4->statement_close)._M_string_length;
    pcVar15 = (pLVar4->statement_close_force_rstrip)._M_dataplus._M_p;
    sVar3 = (pLVar4->statement_close_force_rstrip)._M_string_length;
    bVar13 = pLVar4->trim_blocks;
    closeKind = StatementClose;
    local_68 = sVar3;
    pcStack_60 = pcVar15;
    goto LAB_0012c9f9;
  case CommentStart:
    this->state = CommentBody;
    uVar10 = this->pos + (this->config->comment_open)._M_string_length;
    goto LAB_0012c985;
  case CommentStartForceLstrip:
    this->state = CommentBody;
    uVar10 = this->pos + (this->config->comment_open_force_lstrip)._M_string_length;
LAB_0012c985:
    this->pos = uVar10;
    if (uVar10 < uVar12) {
      uVar10 = uVar12;
    }
    if (uVar7 <= uVar10) {
      uVar10 = uVar7;
    }
    uVar8 = uVar7 - uVar12;
    if (uVar10 - uVar12 <= uVar7 - uVar12) {
      uVar8 = uVar10 - uVar12;
    }
    pcVar11 = (this->m_in)._M_str + uVar12;
    __return_storage_ptr__->kind = CommentOpen;
    goto LAB_0012c9ae;
  case CommentBody:
    uVar10 = this->pos;
    if (uVar10 <= uVar7) {
      local_90._M_str = (this->m_in)._M_str + uVar10;
      local_90._M_len = uVar7 - uVar10;
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_90,(this->config->comment_close)._M_dataplus._M_p,0,
                         (this->config->comment_close)._M_string_length);
      if (sVar5 == 0xffffffffffffffff) {
        uVar12 = (this->m_in)._M_len;
        uVar7 = this->tok_start;
        if (uVar12 < this->tok_start) {
          uVar7 = uVar12;
        }
        this->pos = uVar12;
        pcVar11 = (this->m_in)._M_str;
        __return_storage_ptr__->kind = Eof;
        (__return_storage_ptr__->text)._M_len = uVar12 - uVar7;
        (__return_storage_ptr__->text)._M_str = pcVar11 + uVar7;
        return __return_storage_ptr__;
      }
      uVar7 = (this->m_in)._M_len;
      sVar3 = this->pos;
      uVar10 = (sVar5 + sVar3) - 1;
      uVar12 = uVar7 - uVar10;
      if (uVar10 <= uVar7) {
        pLVar4 = this->config;
        pcVar11 = (this->m_in)._M_str;
        local_90._M_str = pcVar11 + uVar10;
        uVar10 = (pLVar4->comment_close_force_rstrip)._M_string_length;
        local_90._M_len = uVar12;
        if (uVar12 < uVar10) {
          bVar13 = false;
        }
        else {
          __str_07._M_str = (pLVar4->comment_close_force_rstrip)._M_dataplus._M_p;
          __str_07._M_len = uVar10;
          iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_90,0,uVar10,__str_07);
          bVar13 = iVar1 == 0;
          pLVar4 = this->config;
          uVar7 = (this->m_in)._M_len;
          sVar3 = this->pos;
          pcVar11 = (this->m_in)._M_str;
        }
        this->state = Text;
        uVar10 = sVar5 + (pLVar4->comment_close)._M_string_length + sVar3;
        this->pos = uVar10;
        uVar12 = this->tok_start;
        if (uVar7 < this->tok_start) {
          uVar12 = uVar7;
        }
        if (uVar10 < uVar12) {
          uVar10 = uVar12;
        }
        if (uVar7 <= uVar10) {
          uVar10 = uVar7;
        }
        uVar8 = uVar7 - uVar12;
        if (uVar10 - uVar12 <= uVar7 - uVar12) {
          uVar8 = uVar10 - uVar12;
        }
        __return_storage_ptr__->kind = CommentClose;
        (__return_storage_ptr__->text)._M_len = uVar8;
        (__return_storage_ptr__->text)._M_str = pcVar11 + uVar12;
        if ((!bVar13) && (pLVar4->trim_blocks != true)) {
          return __return_storage_ptr__;
        }
        skip_whitespaces_and_first_newline(this);
        return __return_storage_ptr__;
      }
    }
LAB_0012caee:
    ::std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar10
               ,uVar7);
  default:
    uVar10 = this->pos;
    local_70 = uVar12;
    if (uVar7 < uVar10) goto LAB_0012caee;
    pcVar11 = (this->m_in)._M_str;
    if (uVar7 == uVar10) {
LAB_0012c711:
      this->pos = uVar7;
      local_80->kind = Text;
      (local_80->text)._M_len = uVar7 - local_70;
      (local_80->text)._M_str = pcVar11 + local_70;
      return local_80;
    }
    local_78 = this->config;
    __n = (local_78->open_chars)._M_string_length;
    if (__n == 0) goto LAB_0012c711;
    __s = (local_78->open_chars)._M_dataplus._M_p;
    while (pvVar2 = memchr(__s,(int)pcVar11[uVar10],__n), pvVar2 == (void *)0x0) {
      uVar10 = uVar10 + 1;
      if (uVar7 == uVar10) goto LAB_0012c711;
    }
    this->pos = uVar10;
    uVar12 = uVar7 - uVar10;
    if (uVar7 < uVar10) goto LAB_0012caee;
    pcVar11 = pcVar11 + uVar10;
    uVar7 = (local_78->expression_open)._M_string_length;
    pLVar4 = local_78;
    if (uVar12 < uVar7) {
LAB_0012c49b:
      uVar7 = (pLVar4->statement_open)._M_string_length;
      if (uVar7 <= uVar12) {
        __str_00._M_str = (pLVar4->statement_open)._M_dataplus._M_p;
        __str_00._M_len = uVar7;
        local_90._M_len = uVar12;
        local_90._M_str = pcVar11;
        iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_90,0,uVar7,__str_00);
        pLVar4 = this->config;
        if (iVar1 != 0) goto LAB_0012c4ca;
        uVar7 = (pLVar4->statement_open_no_lstrip)._M_string_length;
        if (uVar12 < uVar7) {
LAB_0012c5bd:
          uVar7 = (pLVar4->statement_open_force_lstrip)._M_string_length;
          local_90._M_len = uVar12;
          local_90._M_str = pcVar11;
          if (uVar7 <= uVar12) {
            __str_04._M_str = (pLVar4->statement_open_force_lstrip)._M_dataplus._M_p;
            __str_04._M_len = uVar7;
            iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&local_90,0,uVar7,__str_04);
            if (iVar1 == 0) {
              this->state = StatementStartForceLstrip;
              cVar6 = '\x01';
              __return_storage_ptr__ = local_80;
              goto LAB_0012c69b;
            }
            pLVar4 = this->config;
          }
          this->state = StatementStart;
          cVar6 = pLVar4->lstrip_blocks;
          __return_storage_ptr__ = local_80;
        }
        else {
          __str_03._M_str = (pLVar4->statement_open_no_lstrip)._M_dataplus._M_p;
          __str_03._M_len = uVar7;
          local_90._M_len = uVar12;
          local_90._M_str = pcVar11;
          iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_90,0,uVar7,__str_03);
          if (iVar1 != 0) {
            pLVar4 = this->config;
            goto LAB_0012c5bd;
          }
          this->state = StatementStartNoLstrip;
          cVar6 = '\0';
          __return_storage_ptr__ = local_80;
        }
        goto LAB_0012c69b;
      }
LAB_0012c4ca:
      uVar7 = (pLVar4->comment_open)._M_string_length;
      local_90._M_len = uVar12;
      local_90._M_str = pcVar11;
      if ((uVar7 <= uVar12) &&
         (__str_01._M_str = (pLVar4->comment_open)._M_dataplus._M_p, __str_01._M_len = uVar7,
         iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_90,0,uVar7,__str_01), __return_storage_ptr__ = local_80,
         iVar1 == 0)) {
        pLVar4 = this->config;
        uVar7 = (pLVar4->comment_open_force_lstrip)._M_string_length;
        local_90._M_len = uVar12;
        local_90._M_str = pcVar11;
        if (uVar7 <= uVar12) {
          __str_05._M_str = (pLVar4->comment_open_force_lstrip)._M_dataplus._M_p;
          __str_05._M_len = uVar7;
          iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_90,0,uVar7,__str_05);
          if (iVar1 == 0) {
            this->state = CommentStartForceLstrip;
            goto LAB_0012c699;
          }
          pLVar4 = this->config;
        }
        this->state = CommentStart;
        cVar6 = pLVar4->lstrip_blocks;
        goto LAB_0012c69b;
      }
      __return_storage_ptr__ = local_80;
      sVar3 = this->pos;
      if ((sVar3 == 0) || ((this->m_in)._M_str[sVar3 - 1] == '\n')) {
        uVar7 = (this->config->line_statement)._M_string_length;
        local_90._M_len = uVar12;
        local_90._M_str = pcVar11;
        if (uVar7 <= uVar12) {
          __str_02._M_str = (this->config->line_statement)._M_dataplus._M_p;
          __str_02._M_len = uVar7;
          iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_90,0,uVar7,__str_02);
          if (iVar1 == 0) {
            this->state = LineStart;
            goto LAB_0012c66a;
          }
          sVar3 = this->pos;
        }
      }
      this->pos = sVar3 + 1;
    }
    else {
      __str._M_str = (local_78->expression_open)._M_dataplus._M_p;
      __str._M_len = uVar7;
      local_90._M_len = uVar12;
      local_90._M_str = pcVar11;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_90,0,uVar7,__str);
      pLVar4 = this->config;
      if (iVar1 != 0) goto LAB_0012c49b;
      uVar7 = (pLVar4->expression_open_force_lstrip)._M_string_length;
      local_90._M_len = uVar12;
      local_90._M_str = pcVar11;
      if ((uVar12 < uVar7) ||
         (__str_06._M_str = (pLVar4->expression_open_force_lstrip)._M_dataplus._M_p,
         __str_06._M_len = uVar7,
         iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_90,0,uVar7,__str_06), iVar1 != 0)) {
        this->state = ExpressionStart;
        __return_storage_ptr__ = local_80;
LAB_0012c66a:
        cVar6 = '\0';
      }
      else {
        this->state = ExpressionStartForceLstrip;
        __return_storage_ptr__ = local_80;
LAB_0012c699:
        cVar6 = '\x01';
      }
LAB_0012c69b:
      uVar12 = (this->m_in)._M_len;
      uVar7 = this->tok_start;
      if (uVar12 < this->tok_start) {
        uVar7 = uVar12;
      }
      uVar10 = this->pos;
      if (this->pos < uVar7) {
        uVar10 = uVar7;
      }
      if (uVar12 <= uVar10) {
        uVar10 = uVar12;
      }
      this_00 = (Lexer *)(uVar12 - uVar7);
      if ((Lexer *)(uVar10 - uVar7) <= (Lexer *)(uVar12 - uVar7)) {
        this_00 = (Lexer *)(uVar10 - uVar7);
      }
      text._M_str = (this->m_in)._M_str + uVar7;
      sVar14._M_str = text._M_str;
      sVar14._M_len = (size_t)this_00;
      if (cVar6 != '\0') {
        text._M_len = (size_t)text._M_str;
        sVar14 = clear_final_line_if_whitespace(this_00,text);
      }
      pcVar11 = sVar14._M_str;
      if (sVar14._M_len != 0) {
        __return_storage_ptr__->kind = Text;
        (__return_storage_ptr__->text)._M_len = sVar14._M_len;
        goto LAB_0012c9b2;
      }
    }
    uVar7 = (this->m_in)._M_len;
    uVar12 = this->tok_start;
    if (uVar7 <= uVar12) goto LAB_0012c6f6;
    goto LAB_0012c3d2;
  }
  this->pos = uVar10;
  if (uVar10 < uVar12) {
    uVar10 = uVar12;
  }
  if (uVar7 <= uVar10) {
    uVar10 = uVar7;
  }
  uVar8 = uVar7 - uVar12;
  if (uVar10 - uVar12 <= uVar7 - uVar12) {
    uVar8 = uVar10 - uVar12;
  }
  pcVar11 = (this->m_in)._M_str + uVar12;
  __return_storage_ptr__->kind = StatementOpen;
LAB_0012c9ae:
  (__return_storage_ptr__->text)._M_len = uVar8;
LAB_0012c9b2:
  (__return_storage_ptr__->text)._M_str = pcVar11;
  return __return_storage_ptr__;
}

Assistant:

Token scan() {
    tok_start = pos;

  again:
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }

    switch (state) {
    default:
    case State::Text: {
      // fast-scan to first open character
      const size_t open_start = m_in.substr(pos).find_first_of(config.open_chars);
      if (open_start == std::string_view::npos) {
        // didn't find open, return remaining text as text token
        pos = m_in.size();
        return make_token(Token::Kind::Text);
      }
      pos += open_start;

      // try to match one of the opening sequences, and get the close
      const std::string_view open_str = m_in.substr(pos);
      bool must_lstrip = false;
      if (inja::string_view::starts_with(open_str, config.expression_open)) {
        if (inja::string_view::starts_with(open_str, config.expression_open_force_lstrip)) {
          state = State::ExpressionStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::ExpressionStart;
        }
      } else if (inja::string_view::starts_with(open_str, config.statement_open)) {
        if (inja::string_view::starts_with(open_str, config.statement_open_no_lstrip)) {
          state = State::StatementStartNoLstrip;
        } else if (inja::string_view::starts_with(open_str, config.statement_open_force_lstrip)) {
          state = State::StatementStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::StatementStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if (inja::string_view::starts_with(open_str, config.comment_open)) {
        if (inja::string_view::starts_with(open_str, config.comment_open_force_lstrip)) {
          state = State::CommentStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::CommentStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if ((pos == 0 || m_in[pos - 1] == '\n') && inja::string_view::starts_with(open_str, config.line_statement)) {
        state = State::LineStart;
      } else {
        pos += 1; // wasn't actually an opening sequence
        goto again;
      }

      std::string_view text = string_view::slice(m_in, tok_start, pos);
      if (must_lstrip) {
        text = clear_final_line_if_whitespace(text);
      }

      if (text.empty()) {
        goto again; // don't generate empty token
      }
      return Token(Token::Kind::Text, text);
    }
    case State::ExpressionStart: {
      state = State::ExpressionBody;
      pos += config.expression_open.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::ExpressionStartForceLstrip: {
      state = State::ExpressionBody;
      pos += config.expression_open_force_lstrip.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::LineStart: {
      state = State::LineBody;
      pos += config.line_statement.size();
      return make_token(Token::Kind::LineStatementOpen);
    }
    case State::StatementStart: {
      state = State::StatementBody;
      pos += config.statement_open.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartNoLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_no_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartForceLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_force_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::CommentStart: {
      state = State::CommentBody;
      pos += config.comment_open.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::CommentStartForceLstrip: {
      state = State::CommentBody;
      pos += config.comment_open_force_lstrip.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::ExpressionBody:
      return scan_body(config.expression_close, Token::Kind::ExpressionClose, config.expression_close_force_rstrip);
    case State::LineBody:
      return scan_body("\n", Token::Kind::LineStatementClose);
    case State::StatementBody:
      return scan_body(config.statement_close, Token::Kind::StatementClose, config.statement_close_force_rstrip, config.trim_blocks);
    case State::CommentBody: {
      // fast-scan to comment close
      const size_t end = m_in.substr(pos).find(config.comment_close);
      if (end == std::string_view::npos) {
        pos = m_in.size();
        return make_token(Token::Kind::Eof);
      }

      // Check for trim pattern
      const bool must_rstrip = inja::string_view::starts_with(m_in.substr(pos + end - 1), config.comment_close_force_rstrip);

      // return the entire comment in the close token
      state = State::Text;
      pos += end + config.comment_close.size();
      Token tok = make_token(Token::Kind::CommentClose);

      if (must_rstrip || config.trim_blocks) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }
    }
  }